

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall
File::File(File *this,string *inPath,int umask,bool forRead,bool forWrite,bool create,bool truncate)

{
  bool bVar1;
  uint uVar2;
  int __fd;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  uint uVar7;
  undefined7 in_register_00000089;
  allocator local_61;
  string *local_60;
  undefined4 local_54;
  string fileMode;
  
  this->_vptr_File = (_func_int **)&PTR__File_0014fd60;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  this->stream = (FILE *)0x0;
  local_60 = &this->path;
  this->isReadable = forRead;
  this->isWritable = forWrite;
  this->locked = false;
  std::__cxx11::string::_M_assign((string *)local_60);
  this->valid = false;
  if (forRead || forWrite) {
    std::__cxx11::string::string((string *)&fileMode,"",&local_61);
    uVar2 = 0x241;
    if (!forWrite) {
      uVar2 = 0;
    }
    uVar7 = 2;
    if (!forRead) {
      uVar7 = uVar2 + 2;
    }
    if (!forWrite) {
      uVar7 = 0;
    }
    if (!forRead) {
      uVar7 = uVar2;
    }
    bVar6 = !forRead;
    bVar1 = !forWrite;
    uVar2 = uVar7 | 0x40;
    if (!create) {
      uVar2 = uVar7;
    }
    if (bVar6 || bVar1) {
      uVar2 = uVar7;
    }
    local_54 = (undefined4)CONCAT71(in_register_00000089,create);
    uVar7 = uVar2 | 0x200;
    if (!truncate) {
      uVar7 = uVar2;
    }
    if (!create || (bVar6 || bVar1)) {
      uVar7 = uVar2;
    }
    __fd = open((local_60->_M_dataplus)._M_p,uVar7,(ulong)(~umask & 0x1b6));
    if (__fd == -1) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      bVar1 = false;
      softHSMLog(3,"File",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/File.cpp"
                 ,0x5e,"Could not open the file (%s): %s",pcVar5,(local_60->_M_dataplus)._M_p);
    }
    else {
      if (!bVar6 && !forWrite) {
        std::__cxx11::string::assign((char *)&fileMode);
      }
      if (!bVar1 && !forRead) {
        std::__cxx11::string::assign((char *)&fileMode);
      }
      if ((!bVar6 && !bVar1) && (char)local_54 == '\0') {
        std::__cxx11::string::assign((char *)&fileMode);
      }
      if (create && (!bVar6 && !bVar1)) {
        std::__cxx11::string::assign((char *)&fileMode);
      }
      pFVar3 = fdopen(__fd,fileMode._M_dataplus._M_p);
      this->stream = (FILE *)pFVar3;
      bVar1 = pFVar3 != (FILE *)0x0;
    }
    this->valid = bVar1;
    std::__cxx11::string::~string((string *)&fileMode);
  }
  return;
}

Assistant:

File::File(std::string inPath, int umask, bool forRead /* = true */, bool forWrite /* = false */, bool create /* = false */, bool truncate /* = true */)
{
	stream = NULL;

	isReadable = forRead;
	isWritable = forWrite;
	locked = false;

	path = inPath;
	valid = false;

	if (forRead || forWrite)
	{
		std::string fileMode = "";
		int flags, fd;

#ifndef _WIN32
		flags = 0;
		if (forRead && !forWrite) flags |= O_RDONLY;
		if (!forRead && forWrite) flags |= O_WRONLY | O_CREAT | O_TRUNC;
		if (forRead && forWrite) flags |= O_RDWR;
		if (forRead && forWrite && create) flags |= O_CREAT;
		if (forRead && forWrite && create && truncate) flags |= O_TRUNC;
		// Open the file
		fd = open(path.c_str(), flags, (S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH) & ~umask);
		if (fd == -1)
		{
			ERROR_MSG("Could not open the file (%s): %s", strerror(errno), path.c_str());
			valid = false;
			return;
		}

		if (forRead && !forWrite) fileMode = "r";
		if (!forRead && forWrite) fileMode = "w";
		if (forRead && forWrite && !create) fileMode = "r+";
		if (forRead && forWrite && create) fileMode = "w+";
		// Open the stream
		valid = ((stream = fdopen(fd, fileMode.c_str())) != NULL);
#else
		(void)umask;
		flags = _O_BINARY;
		if (forRead && !forWrite) flags |= _O_RDONLY;
		if (!forRead && forWrite) flags |= _O_WRONLY | _O_CREAT | _O_TRUNC;
		if (forRead && forWrite) flags |= _O_RDWR;
		if (forRead && forWrite && create) flags |= _O_CREAT;
		if (forRead && forWrite && create && truncate) flags |= _O_TRUNC;
		// Open the file
		fd = _open(path.c_str(), flags, _S_IREAD | _S_IWRITE);
		if (fd == -1)
		{
			ERROR_MSG("Could not open the file (%s): %s", strerror(errno), path.c_str());
			valid = false;
			return;
		}

		if (forRead && !forWrite) fileMode = "rb";
		if (!forRead && forWrite) fileMode = "wb";
		if (forRead && forWrite && !create) fileMode = "rb+";
		if (forRead && forWrite && create) fileMode = "wb+";
		// Open the stream
		valid = ((stream = _fdopen(fd, fileMode.c_str())) != NULL);
#endif
	}
}